

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::RemoveDefineFlag(cmMakefile *this,char *flag,size_type len,string *dflags)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  size_type rpos;
  size_type lpos;
  string *dflags_local;
  size_type len_local;
  char *flag_local;
  cmMakefile *this_local;
  
  rpos = std::__cxx11::string::find((char *)dflags,(ulong)flag);
  do {
    if (rpos == 0xffffffffffffffff) {
      return;
    }
    if (rpos == 0) {
LAB_004aece9:
      uVar3 = std::__cxx11::string::size();
      if (rpos + len < uVar3) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)dflags);
        iVar1 = isspace((int)*pcVar2);
        if (iVar1 == 0) goto LAB_004aed41;
      }
      std::__cxx11::string::erase((ulong)dflags,rpos);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)dflags);
      iVar1 = isspace((int)*pcVar2);
      if (iVar1 != 0) goto LAB_004aece9;
    }
LAB_004aed41:
    rpos = std::__cxx11::string::find((char *)dflags,(ulong)flag);
  } while( true );
}

Assistant:

void cmMakefile::RemoveDefineFlag(const char* flag,
                                  std::string::size_type len,
                                  std::string& dflags)
{
  // Remove all instances of the flag that are surrounded by
  // whitespace or the beginning/end of the string.
  for(std::string::size_type lpos = dflags.find(flag, 0);
      lpos != std::string::npos; lpos = dflags.find(flag, lpos))
    {
    std::string::size_type rpos = lpos + len;
    if((lpos <= 0 || isspace(dflags[lpos-1])) &&
       (rpos >= dflags.size() || isspace(dflags[rpos])))
      {
      dflags.erase(lpos, len);
      }
    else
      {
      ++lpos;
      }
    }
}